

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vec4f * __thiscall
DepthShader::vertex(vec4f *__return_storage_ptr__,DepthShader *this,Model *model,int iface,
                   int nthvert)

{
  vec<4UL,_double> local_148;
  mat<4UL,_4UL> local_128;
  mat<4UL,_4UL> local_a8;
  
  Model::vert((vec3f *)&local_128,model,(long)iface,(long)nthvert);
  embed<4ul,3ul,double>(__return_storage_ptr__,(vec3f *)&local_128,1.0);
  operator*(&local_a8,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_128,&local_a8,&(this->super_IShader).uniform_ModelView);
  operator*(&local_148,&local_128,__return_storage_ptr__);
  __return_storage_ptr__->data[2] = local_148.data[2];
  __return_storage_ptr__->data[3] = local_148.data[3];
  __return_storage_ptr__->data[0] = local_148.data[0];
  __return_storage_ptr__->data[1] = local_148.data[1];
  operator/(local_128.rows,__return_storage_ptr__,__return_storage_ptr__->data + 3);
  proj<3ul,4ul,double>((vec<3UL,_double> *)&local_a8,local_128.rows);
  mat<3UL,_3UL>::set_col(&this->varying_tri,(long)nthvert,(vec<3UL,_double> *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));  // read the vertex from .obj file
        gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                    gl_Vertex;  // transform it to screen coordinates
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }